

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures::~IfcSurfaceStyleWithTextures
          (IfcSurfaceStyleWithTextures *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>).
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                   *)&(this->
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleWithTextures,_1UL>)
                      .field_0x10);
  return;
}

Assistant:

IfcSurfaceStyleWithTextures() : Object("IfcSurfaceStyleWithTextures") {}